

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdoc.c
# Opt level: O0

Node * CleanNode(TidyDocImpl *doc,Node *node)

{
  ulong uVar1;
  ulong uVar2;
  Bool BVar3;
  TidyTriState mergeSpans;
  TidyTriState mergeDivs;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x32].v;
  uVar2 = (doc->config).value[0x34].v;
  next = node;
  node_local = &doc->root;
  do {
    _mergeSpans = next;
    BVar3 = prvTidynodeIsElement(next);
    if (BVar3 == no) {
      return _mergeSpans;
    }
    BVar3 = Dir2Div((TidyDocImpl *)node_local,next,(Node **)&mergeSpans);
    if (BVar3 == no) {
      BVar3 = NestedList((TidyDocImpl *)node_local,next,(Node **)&mergeSpans);
      if (BVar3 != no) {
        return _mergeSpans;
      }
      BVar3 = Center2Div((TidyDocImpl *)node_local,next,(Node **)&mergeSpans);
      if ((((BVar3 == no) &&
           (BVar3 = MergeNestedElements((TidyDocImpl *)node_local,TidyTag_DIV,(TidyTriState)uVar1,
                                        next,(Node **)&mergeSpans), BVar3 == no)) &&
          (BVar3 = MergeNestedElements((TidyDocImpl *)node_local,TidyTag_SPAN,(TidyTriState)uVar2,
                                       next,(Node **)&mergeSpans), BVar3 == no)) &&
         (((BVar3 = BlockStyle((TidyDocImpl *)node_local,next,(Node **)&mergeSpans), BVar3 == no &&
           (BVar3 = InlineStyle((TidyDocImpl *)node_local,next,(Node **)&mergeSpans), BVar3 == no))
          && ((BVar3 = InlineElementToCSS((TidyDocImpl *)node_local,next,(Node **)&mergeSpans),
              BVar3 == no &&
              (BVar3 = Font2Span((TidyDocImpl *)node_local,next,(Node **)&mergeSpans), BVar3 == no))
             )))) {
        return _mergeSpans;
      }
    }
    next = _mergeSpans;
  } while( true );
}

Assistant:

static void CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *child, *next;

    if (node->content)
    {
        for (child = node->content; child != NULL; child = next)
        {
            next = child->next;

            if (TY_(nodeIsElement)(child))
            {
                if (nodeIsSTYLE(child))
                    TY_(DiscardElement)(doc, child);
                if (nodeIsP(child) && !child->content)
                    TY_(DiscardElement)(doc, child);
                else if (nodeIsSPAN(child))
                    DiscardContainer( doc, child, &next);
                else if (nodeIsA(child) && !child->content)
                 {
                    AttVal *id = TY_(GetAttrByName)( child, "name" );
                    /* Recent Google Docs is using "id" instead of "name" in
                    ** the exported html.
                    */
                    if (!id)
                        id = TY_(GetAttrByName)( child, "id" );

                    if (id)
                        TY_(RepairAttrValue)( doc, child->parent, "id", id->value );

                    TY_(DiscardElement)(doc, child);
                }
                else
                {
                    if (child->attributes)
                        TY_(DropAttrByName)( doc, child, "class" );

                    CleanNode(doc, child);
                }
            }
        }
    }
}